

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* testing::internal::ActionResultHolder<std::__cxx11::string>::
  PerformDefaultAction<std::__cxx11::string()>
            (FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  Result local_60;
  ReferenceOrValueWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x28);
  FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::PerformDefaultAction
            (&local_60,
             (FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)args_local,(ArgumentTuple *)call_description_local,local_20);
  ReferenceOrValueWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ReferenceOrValueWrapper(&local_40,&local_60);
  ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ActionResultHolder(this,&local_40);
  ReferenceOrValueWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ReferenceOrValueWrapper(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }